

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
Publisher(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
                *topics)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *t;
  __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  *__x;
  key_type local_50;
  
  this->_vptr_Publisher = (_func_int **)&PTR___cxa_pure_virtual_0010cd10;
  Publisher<std::__cxx11::string*>::get_counter()::counter =
       Publisher<std::__cxx11::string*>::get_counter()::counter + 1;
  this->id = Publisher<std::__cxx11::string*>::get_counter()::counter;
  p_Var1 = &(this->m_reverse)._M_t._M_impl.super__Rb_tree_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_signals)._M_t._M_impl.super__Rb_tree_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var2 = &((topics->
             super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ;
  for (__x = &((topics->
               super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
      ; __x != p_Var2; __x = __x + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&__x->_M_ptr->_name);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
               ::operator[](&this->m_reverse,&local_50)->
               super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::
    __shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(this_00,__x);
    std::__cxx11::string::~string((string *)&local_50);
    Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::attach
              (__x->_M_ptr,this);
    std::
    vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
    ::push_back(&this->m_topics,(value_type *)__x);
  }
  return;
}

Assistant:

Publisher(const std::vector<topic_ptr_t<T>>& topics)
		: id{get_counter()}
		{
			for (auto& t : topics)
			{
				m_reverse[t->get_name()] = t;
				t->attach(this);
				m_topics.push_back(t);
			}
		}